

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O0

int h264_total_zeros(bitstream *str,int mode,int tzVlcIndex,uint32_t *val)

{
  int iVar1;
  vs_vlc_val *local_30;
  vs_vlc_val *tab;
  uint32_t *val_local;
  int tzVlcIndex_local;
  int mode_local;
  bitstream *str_local;
  
  if (mode == 0) {
    local_30 = total_zeros_tab[tzVlcIndex];
  }
  else if (mode == 1) {
    local_30 = total_zeros_c1_tab[tzVlcIndex];
  }
  else {
    if (mode != 2) {
      abort();
    }
    local_30 = total_zeros_c2_tab[tzVlcIndex];
  }
  iVar1 = vs_vlc(str,val,local_30);
  str_local._4_4_ = (uint)(iVar1 != 0);
  return str_local._4_4_;
}

Assistant:

int h264_total_zeros(struct bitstream *str, int mode, int tzVlcIndex, uint32_t *val) {
	const struct vs_vlc_val *tab;
	switch (mode) {
		case 0:
			tab = total_zeros_tab[tzVlcIndex];
			break;
		case 1:
			tab = total_zeros_c1_tab[tzVlcIndex];
			break;
		case 2:
			tab = total_zeros_c2_tab[tzVlcIndex];
			break;
		default:
			abort();
	}
	if (vs_vlc(str, val, tab)) return 1;
	return 0;
}